

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O3

void __thiscall
qclab::qgates::SWAP<float>::apply
          (SWAP<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_8_1_703dd281 f;
  int *local_40 [2];
  long local_30;
  anon_class_8_1_703dd281 local_28;
  
  (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[5])(local_40,this);
  iVar1 = *local_40[0];
  *local_40[0] = iVar1 + offset;
  iVar2 = local_40[0][1];
  local_40[0][1] = offset + iVar2;
  local_28.vector = *(float **)vector;
  apply4bc<qclab::qgates::lambda_SWAP<float>(qclab::Op,float*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,offset + iVar2,&local_28);
  if (local_40[0] != (int *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
  }
  return;
}

Assistant:

void SWAP< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                         const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_SWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }